

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

void ZSTDMT_waitForLdmComplete(ZSTDMT_CCtx *mtctx,buffer_t buffer)

{
  buffer_t buffer_00;
  int iVar1;
  pthread_mutex_t *__mutex;
  size_t in_RSI;
  void *in_RDI;
  ZSTD_window_t in_stack_00000000;
  pthread_mutex_t *mutex;
  
  if (*(int *)((long)in_RDI + 0x88) == 1) {
    __mutex = (pthread_mutex_t *)((long)in_RDI + 0xb18);
    pthread_mutex_lock(__mutex);
    while( true ) {
      buffer_00.capacity = in_RSI;
      buffer_00.start = in_RDI;
      iVar1 = ZSTDMT_doesOverlapWindow(buffer_00,in_stack_00000000);
      if (iVar1 == 0) break;
      pthread_cond_wait((pthread_cond_t *)((long)in_RDI + 0xb40),__mutex);
    }
    pthread_mutex_unlock(__mutex);
  }
  return;
}

Assistant:

static void ZSTDMT_waitForLdmComplete(ZSTDMT_CCtx* mtctx, buffer_t buffer)
{
    if (mtctx->params.ldmParams.enableLdm == ZSTD_ps_enable) {
        ZSTD_pthread_mutex_t* mutex = &mtctx->serial.ldmWindowMutex;
        DEBUGLOG(5, "ZSTDMT_waitForLdmComplete");
        DEBUGLOG(5, "source  [0x%zx, 0x%zx)",
                    (size_t)buffer.start,
                    (size_t)buffer.start + buffer.capacity);
        ZSTD_PTHREAD_MUTEX_LOCK(mutex);
        while (ZSTDMT_doesOverlapWindow(buffer, mtctx->serial.ldmWindow)) {
            DEBUGLOG(5, "Waiting for LDM to finish...");
            ZSTD_pthread_cond_wait(&mtctx->serial.ldmWindowCond, mutex);
        }
        DEBUGLOG(6, "Done waiting for LDM to finish");
        ZSTD_pthread_mutex_unlock(mutex);
    }
}